

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O3

void __thiscall CUIRect::Draw(CUIRect *this,vec4 *Color,float Rounding,int Corners)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar7;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar8;
  undefined4 uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  CQuadItem a_QuadItems [9];
  CFreeformItem a_FreeformItems [32];
  float local_4c8 [7];
  float local_4ac;
  float local_4a8;
  float local_4a4;
  float local_4a0;
  float local_49c;
  float local_498;
  float local_494;
  float local_490;
  float local_48c;
  float local_488;
  float local_484;
  float local_480;
  float local_47c;
  undefined8 local_478;
  float local_470 [14];
  undefined8 local_438;
  float afStack_430 [4];
  undefined8 auStack_420 [125];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            ((ulong)(uint)((Color->field_0).x * (Color->field_3).w),
             (ulong)(uint)((Color->field_1).y * (Color->field_3).w));
  auVar29._0_4_ = -(uint)((Corners & 8U) == 0);
  auVar29._4_4_ = -(uint)((Corners & 4U) == 0);
  auVar29._8_4_ = -(uint)((Corners & 2U) == 0);
  auVar29._12_4_ = -(uint)((Corners & 1U) == 0);
  auVar28._0_4_ = -(uint)((Corners & 0x80U) == 0);
  auVar28._4_4_ = -(uint)((Corners & 0x40U) == 0);
  auVar28._8_4_ = -(uint)((Corners & 0x20U) == 0);
  auVar28._12_4_ = -(uint)((Corners & 0x10U) == 0);
  auVar29 = packssdw(auVar28,auVar29);
  auVar29 = packsswb(auVar29,auVar29);
  uVar18 = 0;
  uVar19 = 0;
  do {
    fVar25 = (float)(int)(uVar19 + 1) / 5.092958;
    fVar26 = (float)(int)(uVar19 + 2) / 5.092958;
    fVar21 = cosf((float)(int)uVar19 / 5.092958);
    fVar22 = cosf(fVar25);
    fVar23 = cosf(fVar26);
    fVar24 = sinf((float)(int)uVar19 / 5.092958);
    fVar25 = sinf(fVar25);
    fVar26 = sinf(fVar26);
    if ((auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      uVar1 = this->x;
      uVar9 = this->y;
      (&local_438)[lVar15 * 4] = CONCAT44((float)uVar9 + Rounding,(float)uVar1 + Rounding);
      afStack_430[lVar15 * 8] = (1.0 - fVar21) * Rounding + (float)uVar1;
      afStack_430[lVar15 * 8 + 1] = (1.0 - fVar24) * Rounding + (float)uVar9;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = (1.0 - fVar23) * Rounding + (float)uVar1;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = (1.0 - fVar26) * Rounding + (float)uVar9;
      auStack_420[lVar15 * 4] =
           CONCAT44((1.0 - fVar25) * Rounding + (float)uVar9,
                    (1.0 - fVar22) * Rounding + (float)uVar1);
    }
    if ((auVar29 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar30 = this->y;
      fVar27 = (this->x + this->w) - Rounding;
      lVar15 = (long)(int)uVar18;
      *(float *)(&local_438 + lVar15 * 4) = fVar27;
      uVar18 = uVar18 + 1;
      *(float *)((long)&local_438 + lVar15 * 0x20 + 4) = fVar30 + Rounding;
      afStack_430[lVar15 * 8] = fVar21 * Rounding + fVar27;
      afStack_430[lVar15 * 8 + 1] = (1.0 - fVar24) * Rounding + fVar30;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = fVar23 * Rounding + fVar27;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = (1.0 - fVar26) * Rounding + fVar30;
      auStack_420[lVar15 * 4] =
           CONCAT44((1.0 - fVar25) * Rounding + fVar30,fVar22 * Rounding + fVar27);
    }
    if ((auVar29 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar30 = this->x;
      fVar27 = (this->y + this->h) - Rounding;
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      *(float *)(&local_438 + lVar15 * 4) = fVar30 + Rounding;
      *(float *)((long)&local_438 + lVar15 * 0x20 + 4) = fVar27;
      afStack_430[lVar15 * 8] = (1.0 - fVar21) * Rounding + fVar30;
      afStack_430[lVar15 * 8 + 1] = fVar24 * Rounding + fVar27;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = (1.0 - fVar23) * Rounding + fVar30;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = fVar26 * Rounding + fVar27;
      auStack_420[lVar15 * 4] =
           CONCAT44(fVar25 * Rounding + fVar27,(1.0 - fVar22) * Rounding + fVar30);
    }
    if ((auVar29 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      uVar2 = this->x;
      uVar10 = this->y;
      uVar3 = this->w;
      uVar11 = this->h;
      fVar30 = ((float)uVar3 + (float)uVar2) - Rounding;
      fVar27 = ((float)uVar11 + (float)uVar10) - Rounding;
      (&local_438)[lVar15 * 4] = CONCAT44(fVar27,fVar30);
      afStack_430[lVar15 * 8] = fVar21 * Rounding + fVar30;
      afStack_430[lVar15 * 8 + 1] = fVar24 * Rounding + fVar27;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = fVar23 * Rounding + fVar30;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = fVar26 * Rounding + fVar27;
      auStack_420[lVar15 * 4] = CONCAT44(fVar25 * Rounding + fVar27,fVar22 * Rounding + fVar30);
    }
    if ((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      uVar7._0_4_ = this->x;
      uVar7._4_4_ = this->y;
      fVar30 = (float)uVar7._4_4_ - Rounding;
      (&local_438)[lVar15 * 4] = uVar7;
      afStack_430[lVar15 * 8] = (1.0 - fVar21) * Rounding + (float)(undefined4)uVar7;
      afStack_430[lVar15 * 8 + 1] = fVar24 * Rounding + fVar30;
      *(float *)(auStack_420 + lVar15 * 4 + -1) =
           (1.0 - fVar23) * Rounding + (float)(undefined4)uVar7;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = fVar26 * Rounding + fVar30;
      auStack_420[lVar15 * 4] =
           CONCAT44(fVar25 * Rounding + fVar30,(1.0 - fVar22) * Rounding + (float)(undefined4)uVar7)
      ;
    }
    if ((auVar29 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar30 = this->y;
      fVar27 = this->x + this->w;
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      *(float *)(&local_438 + lVar15 * 4) = fVar27;
      *(float *)((long)&local_438 + lVar15 * 0x20 + 4) = fVar30;
      fVar27 = fVar27 - Rounding;
      fVar30 = fVar30 - Rounding;
      afStack_430[lVar15 * 8] = fVar21 * Rounding + fVar27;
      afStack_430[lVar15 * 8 + 1] = fVar24 * Rounding + fVar30;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = fVar23 * Rounding + fVar27;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = fVar26 * Rounding + fVar30;
      auStack_420[lVar15 * 4] = CONCAT44(fVar25 * Rounding + fVar30,fVar22 * Rounding + fVar27);
    }
    if ((auVar29 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar30 = this->x;
      fVar27 = this->y + this->h;
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      *(float *)(&local_438 + lVar15 * 4) = fVar30;
      *(float *)((long)&local_438 + lVar15 * 0x20 + 4) = fVar27;
      afStack_430[lVar15 * 8] = (1.0 - fVar21) * Rounding + fVar30;
      afStack_430[lVar15 * 8 + 1] = (1.0 - fVar24) * Rounding + fVar27;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = (1.0 - fVar23) * Rounding + fVar30;
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = (1.0 - fVar26) * Rounding + fVar27;
      auStack_420[lVar15 * 4] =
           CONCAT44((1.0 - fVar25) * Rounding + fVar27,(1.0 - fVar22) * Rounding + fVar30);
    }
    if ((auVar29 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar15 = (long)(int)uVar18;
      uVar18 = uVar18 + 1;
      uVar4 = this->x;
      uVar12 = this->y;
      uVar5 = this->w;
      uVar13 = this->h;
      fVar30 = (float)uVar5 + (float)uVar4;
      fVar27 = (float)uVar13 + (float)uVar12;
      (&local_438)[lVar15 * 4] = CONCAT44(fVar27,fVar30);
      afStack_430[lVar15 * 8] = fVar21 * Rounding + (fVar30 - Rounding);
      afStack_430[lVar15 * 8 + 1] = (1.0 - fVar24) * Rounding + fVar27;
      *(float *)(auStack_420 + lVar15 * 4 + -1) = fVar23 * Rounding + (fVar30 - Rounding);
      *(float *)((long)auStack_420 + lVar15 * 0x20 + -4) = (1.0 - fVar26) * Rounding + fVar27;
      auStack_420[lVar15 * 4] =
           CONCAT44((1.0 - fVar25) * Rounding + fVar27,fVar22 * Rounding + (fVar30 - Rounding));
    }
    bVar20 = uVar19 < 6;
    uVar19 = uVar19 + 2;
  } while (bVar20);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(s_pGraphics,&local_438,(ulong)uVar18);
  fVar21 = -Rounding;
  uVar8._0_4_ = this->x;
  uVar8._4_4_ = this->y;
  uVar6 = this->w;
  uVar14 = this->h;
  local_4c8[0] = Rounding + (float)(undefined4)uVar8;
  local_4c8[1] = Rounding + (float)uVar8._4_4_;
  fVar22 = (float)(undefined4)uVar8 + (float)uVar6;
  fVar23 = (float)uVar8._4_4_ + (float)uVar14;
  local_4c8[2] = (float)uVar6 - (Rounding + Rounding);
  local_4c8[3] = (float)uVar14 - (Rounding + Rounding);
  local_4a4 = fVar23 - Rounding;
  local_488 = fVar22 - Rounding;
  uVar16 = 5;
  if ((auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar16 = 6;
    local_478 = uVar8;
    local_470[0] = Rounding;
    local_470[1] = Rounding;
  }
  if ((auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar17 = (ulong)(uint)((int)uVar16 << 4);
    *(float *)((long)local_4c8 + uVar17) = fVar22;
    *(undefined4 *)((long)local_4c8 + uVar17 + 4) = uVar8._4_4_;
    *(float *)((long)local_4c8 + uVar17 + 8) = fVar21;
    *(float *)((long)local_4c8 + uVar17 + 0xc) = Rounding;
    uVar16 = (ulong)((int)uVar16 + 1);
  }
  if ((auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar17 = (ulong)(uint)((int)uVar16 << 4);
    *(undefined4 *)((long)local_4c8 + uVar17) = (undefined4)uVar8;
    *(float *)((long)local_4c8 + uVar17 + 4) = fVar23;
    *(float *)((long)local_4c8 + uVar17 + 8) = Rounding;
    *(float *)((long)local_4c8 + uVar17 + 0xc) = fVar21;
    uVar16 = (ulong)((int)uVar16 + 1);
  }
  if ((auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar17 = (ulong)(uint)((int)uVar16 << 4);
    *(ulong *)((long)local_4c8 + uVar17) = CONCAT44(fVar23,fVar22);
    *(float *)((long)local_4c8 + uVar17 + 8) = fVar21;
    *(float *)((long)local_4c8 + uVar17 + 0xc) = fVar21;
    uVar16 = (ulong)((int)uVar16 + 1);
  }
  local_4c8[4] = local_4c8[0];
  local_4c8[5] = (float)uVar8._4_4_;
  local_4c8[6] = local_4c8[2];
  local_4ac = Rounding;
  local_4a8 = local_4c8[0];
  local_4a0 = local_4c8[2];
  local_49c = Rounding;
  local_498 = (float)(undefined4)uVar8;
  local_494 = local_4c8[1];
  local_490 = Rounding;
  local_48c = local_4c8[3];
  local_484 = local_4c8[1];
  local_480 = Rounding;
  local_47c = local_4c8[3];
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,local_4c8,uVar16);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUIRect::Draw(const vec4 &Color, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();

	// TODO: FIX US
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color.r*Color.a, Color.g*Color.a, Color.b*Color.a, Color.a);

	const float r = Rounding;

	IGraphics::CFreeformItem a_FreeformItems[NUM_ROUND_CORNER_SEGMENTS/2*8];
	int NumFreeformItems = 0;
	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i += 2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);

		if(Corners&CORNER_TR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);

		if(Corners&CORNER_BL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);

		if(Corners&CORNER_BR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);

		if(Corners&CORNER_ITL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);

		if(Corners&CORNER_ITR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);

		if(Corners&CORNER_IBL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);

		if(Corners&CORNER_IBR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
	}
	s_pGraphics->QuadsDrawFreeform(a_FreeformItems, NumFreeformItems);

	IGraphics::CQuadItem a_QuadItems[9];
	int NumQuadItems = 0;
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2); // center
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y, w-r*2, r); // top
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r); // bottom
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+r, r, h-r*2); // left
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2); // right

	if(!(Corners&CORNER_TL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y, r, r);
	if(!(Corners&CORNER_TR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y, -r, r);
	if(!(Corners&CORNER_BL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+h, r, -r);
	if(!(Corners&CORNER_BR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y+h, -r, -r);

	s_pGraphics->QuadsDrawTL(a_QuadItems, NumQuadItems);
	s_pGraphics->QuadsEnd();
}